

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.h
# Opt level: O0

int32_t icu_63::CollationBuilder::indexFromTempCE(int64_t tempCE)

{
  int iVar1;
  int64_t tempCE_local;
  
  iVar1 = (int)((ulong)(tempCE + -0x4040000006002000) >> 0x20);
  return iVar1 >> 0xb & 0xfe000U | iVar1 >> 10 & 0x1fc0U |
         (uint)((ulong)(tempCE + -0x4040000006002000) >> 0x18) & 0x3f;
}

Assistant:

static inline int32_t indexFromTempCE(int64_t tempCE) {
        tempCE -= INT64_C(0x4040000006002000);
        return
            ((int32_t)(tempCE >> 43) & 0xfe000) |
            ((int32_t)(tempCE >> 42) & 0x1fc0) |
            ((int32_t)(tempCE >> 24) & 0x3f);
    }